

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::timestamp_t,duckdb::DatePart::YearWeekOperator,long>
          (vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  bool bVar1;
  reference stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> in_RDI;
  BaseStatistics result;
  long max_part;
  long min_part;
  timestamp_t max;
  timestamp_t min;
  value_type *nstats;
  LogicalType *in_stack_fffffffffffffe78;
  timestamp_t in_stack_fffffffffffffe80;
  Value *new_min;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> val;
  Value *in_stack_fffffffffffffea0;
  BaseStatistics *in_stack_fffffffffffffec8;
  BaseStatistics *in_stack_fffffffffffffed8;
  LogicalType *in_stack_ffffffffffffff48;
  timestamp_t local_30;
  timestamp_t local_28;
  reference local_20;
  
  val._M_head_impl = in_RDI._M_head_impl;
  local_20 = vector<duckdb::BaseStatistics,_true>::operator[]
                       ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffe80.value,
                        (size_type)in_stack_fffffffffffffe78);
  bVar1 = NumericStats::HasMinMax((BaseStatistics *)in_stack_fffffffffffffe80.value);
  if (bVar1) {
    local_28 = NumericStats::GetMin<duckdb::timestamp_t>(in_stack_fffffffffffffed8);
    local_30 = NumericStats::GetMax<duckdb::timestamp_t>(in_stack_fffffffffffffed8);
    bVar1 = timestamp_t::operator>(&local_28,&local_30);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe80.value,in_stack_fffffffffffffe78);
    }
    else {
      bVar1 = Value::IsFinite<duckdb::timestamp_t>(in_stack_fffffffffffffe80);
      if ((bVar1) &&
         (bVar1 = Value::IsFinite<duckdb::timestamp_t>(in_stack_fffffffffffffe80), bVar1)) {
        YearWeekOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffe80);
        YearWeekOperator::Operation<duckdb::timestamp_t,long>(in_stack_fffffffffffffe80);
        new_min = (Value *)&stack0xffffffffffffff30;
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffffe80.value,in_stack_fffffffffffffe78);
        NumericStats::CreateEmpty(in_stack_ffffffffffffff48);
        LogicalType::~LogicalType((LogicalType *)0x1fecc9d);
        Value::Value(in_stack_fffffffffffffea0,(int64_t)val._M_head_impl);
        NumericStats::SetMin(in_RDI._M_head_impl,new_min);
        Value::~Value((Value *)in_stack_fffffffffffffe80.value);
        Value::Value(in_stack_fffffffffffffea0,(int64_t)val._M_head_impl);
        NumericStats::SetMax(in_RDI._M_head_impl,new_min);
        Value::~Value((Value *)in_stack_fffffffffffffe80.value);
        stats = vector<duckdb::BaseStatistics,_true>::operator[]
                          ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffe80.value,
                           (size_type)in_stack_fffffffffffffe78);
        BaseStatistics::CopyValidity((BaseStatistics *)&stack0xffffffffffffff48,stats);
        BaseStatistics::ToUnique(in_stack_fffffffffffffec8);
        BaseStatistics::~BaseStatistics(stats);
      }
      else {
        unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
        unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                  ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)in_stack_fffffffffffffe80.value,in_stack_fffffffffffffe78);
      }
    }
  }
  else {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe80.value,in_stack_fffffffffffffe78);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         val._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}